

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O0

void pulse_prog_imp(CHAR_DATA *mob)

{
  bool bVar1;
  int iVar2;
  OBJ_DATA *in_RDI;
  OBJ_DATA *steal;
  CHAR_DATA *victim;
  CHAR_DATA *in_stack_00000018;
  OBJ_DATA *in_stack_00000020;
  CHAR_DATA *in_stack_00000028;
  int in_stack_00000214;
  CHAR_DATA *in_stack_00000218;
  CHAR_DATA *in_stack_00000220;
  CHAR_DATA *ch;
  OBJ_DATA *obj;
  
  iVar2 = number_percent();
  if ((iVar2 < 0x29) && ((short)in_RDI[1].extra_flags[0] == 8)) {
    for (obj = *(OBJ_DATA **)(in_RDI->extra_flags[1] + 0x18); obj != (OBJ_DATA *)0x0;
        obj = obj->next_content) {
      iVar2 = number_percent();
      if ((0x61 < iVar2) &&
         (((in_RDI->contains == (OBJ_DATA *)0x0 ||
           ((obj != in_RDI->contains &&
            (bVar1 = is_safe_new(in_stack_00000018,mob,victim._7_1_), !bVar1)))) && (in_RDI != obj))
         )) {
        for (ch = *(CHAR_DATA **)&obj->item_type; ch != (CHAR_DATA *)0x0; ch = ch->next_in_room) {
          if ((ch->version == -1) &&
             (bVar1 = can_see_obj(in_stack_00000028,in_stack_00000020), bVar1)) {
            iVar2 = number_percent();
            if (iVar2 < 0x4c) {
              obj_from_char((OBJ_DATA *)mob);
              obj_to_char(obj,ch);
              return;
            }
            bVar1 = is_npc(ch);
            if (!bVar1) {
              return;
            }
            multi_hit(in_stack_00000220,in_stack_00000218,in_stack_00000214);
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void pulse_prog_imp(CHAR_DATA *mob)
{
	CHAR_DATA *victim;
	OBJ_DATA *steal;

	if (number_percent() > 40 || mob->position != POS_STANDING)
		return;

	for (victim = mob->in_room->people; victim; victim = victim->next_in_room)
	{
		if (number_percent() < 98
			|| (mob->master && (victim == mob->master || is_safe_new(mob->master, victim, false)))
			|| mob == victim)
		{
			continue;
		}

		for (steal = victim->carrying; steal; steal = steal->next_content)
		{
			if (steal->wear_loc == WEAR_NONE && can_see_obj(mob, steal))
			{
				if (number_percent() > 75)
				{
					if (is_npc(victim))
						multi_hit(victim, mob, TYPE_UNDEFINED);
				}
				else
				{
					obj_from_char(steal);
					obj_to_char(steal, mob);
				}

				return;
			}
		}
	}
}